

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O1

int smf_save(smf_t *smf,char *file_name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  smf_track_t *psVar5;
  smf_event_t *psVar6;
  undefined8 *puVar7;
  FILE *__s;
  size_t sVar8;
  int *piVar9;
  char *pcVar10;
  smf_t *psVar11;
  smf_track_t *psVar12;
  smf_event_t *psVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  ushort uVar17;
  int iVar18;
  uchar *puVar19;
  ushort uVar20;
  ushort uVar21;
  uchar buf [128];
  undefined1 local_c2;
  undefined1 local_c1;
  smf_t *local_c0;
  undefined4 local_b8 [34];
  
  smf_rewind(smf);
  if (smf->file_buffer != (void *)0x0) {
    __assert_fail("smf->file_buffer == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x1c3,"int pointers_are_clear(smf_t *)");
  }
  if (smf->file_buffer_length != 0) {
    __assert_fail("smf->file_buffer_length == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x1c4,"int pointers_are_clear(smf_t *)");
  }
  if (0 < smf->number_of_tracks) {
    iVar18 = 0;
    do {
      iVar18 = iVar18 + 1;
      psVar5 = smf_get_track_by_number(smf,iVar18);
      if (psVar5 == (smf_track_t *)0x0) {
        __assert_fail("track != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x1c9,"int pointers_are_clear(smf_t *)");
      }
      if (psVar5->file_buffer != (void *)0x0) {
        __assert_fail("track->file_buffer == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x1ca,"int pointers_are_clear(smf_t *)");
      }
      if (psVar5->file_buffer_length != 0) {
        __assert_fail("track->file_buffer_length == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x1cb,"int pointers_are_clear(smf_t *)");
      }
    } while (iVar18 < smf->number_of_tracks);
  }
  if (2 < (uint)smf->format) {
    pcVar16 = "SMF error: smf->format is less than zero of greater than two.";
LAB_0010eb06:
    g_log("libsmf",8,pcVar16);
    return -1;
  }
  if (smf->number_of_tracks < 1) {
    pcVar16 = "SMF error: number of tracks is less than one.";
    goto LAB_0010eb06;
  }
  if (smf->number_of_tracks != 1 && smf->format == 0) {
    pcVar16 = "SMF error: format is 0, but number of tracks is more than one.";
    goto LAB_0010eb06;
  }
  if (smf->ppqn < 1) {
    pcVar16 = "SMF error: PPQN has to be > 0.";
    goto LAB_0010eb06;
  }
  local_c0 = (smf_t *)file_name;
  iVar18 = 1;
  do {
    psVar5 = smf_get_track_by_number(smf,iVar18);
    if (psVar5 == (smf_track_t *)0x0) {
      __assert_fail("track",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x204,"int smf_validate(smf_t *)");
    }
    if (psVar5->number_of_events < 1) {
LAB_0010ea41:
      iVar4 = smf_track_add_eot_delta_pulses(psVar5,0);
      if (iVar4 != 0) {
        pcVar16 = "smf_track_add_eot_delta_pulses failed.";
        goto LAB_0010eb06;
      }
    }
    else {
      bVar2 = false;
      iVar4 = 1;
      do {
        psVar6 = smf_track_get_event_by_number(psVar5,iVar4);
        if (psVar6 == (smf_event_t *)0x0) {
          __assert_fail("event",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x20a,"int smf_validate(smf_t *)");
        }
        iVar3 = smf_event_is_valid(psVar6);
        if (iVar3 == 0) {
          g_log("libsmf",8,"Event #%d on track #%d is invalid.",iVar4,iVar18);
          return -1;
        }
        bVar1 = bVar2;
        if ((((psVar6->midi_buffer_length == 3) && (puVar19 = psVar6->midi_buffer, *puVar19 == 0xff)
             ) && (puVar19[1] == '/')) && ((puVar19[2] == '\0' && (bVar1 = true, bVar2)))) {
          g_log("libsmf",8,"Duplicate End Of Track event on track #%d.",iVar18);
          return -1;
        }
        bVar2 = bVar1;
        bVar1 = iVar4 < psVar5->number_of_events;
        iVar4 = iVar4 + 1;
      } while (bVar1);
      if (!bVar2) goto LAB_0010ea41;
    }
    bVar2 = iVar18 < smf->number_of_tracks;
    iVar18 = iVar18 + 1;
  } while (bVar2);
  iVar18 = smf->format;
  iVar4 = smf->ppqn;
  iVar3 = smf->number_of_tracks;
  puVar7 = (undefined8 *)smf_extend(smf,0xe);
  if (puVar7 == (undefined8 *)0x0) {
    g_log("libsmf",8,"Cannot extend track buffer.");
    return -2;
  }
  uVar17 = (ushort)iVar4;
  uVar20 = (ushort)iVar3;
  uVar21 = (ushort)iVar18;
  *puVar7 = 0x60000006468544d;
  *(ushort *)(puVar7 + 1) = uVar21 << 8 | uVar21 >> 8;
  *(ushort *)((long)puVar7 + 10) = uVar20 << 8 | uVar20 >> 8;
  *(ushort *)((long)puVar7 + 0xc) = uVar17 << 8 | uVar17 >> 8;
  if (0 < smf->number_of_tracks) {
    iVar18 = 1;
LAB_0010eb92:
    psVar5 = smf_get_track_by_number(smf,iVar18);
    if (psVar5 == (smf_track_t *)0x0) {
      __assert_fail("track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                    ,0x27a,"int smf_save(smf_t *, const char *)");
    }
    local_b8[0] = 0x6b72544d;
    iVar4 = track_append(psVar5,local_b8,8);
joined_r0x0010ebc5:
    do {
      if (iVar4 != 0) goto LAB_0010ed57;
      psVar6 = smf_track_get_next_event(psVar5);
      if (psVar6 == (smf_event_t *)0x0) {
        if (psVar5->file_buffer == (void *)0x0) {
          __assert_fail("track->file_buffer != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x163,"int write_mtrk_length(smf_track_t *)");
        }
        if (psVar5->file_buffer_length < 6) {
          __assert_fail("track->file_buffer_length >= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                        ,0x164,"int write_mtrk_length(smf_track_t *)");
        }
        uVar14 = psVar5->file_buffer_length - 8;
        *(uint *)((long)psVar5->file_buffer + 4) =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 * 0x1000000
        ;
        iVar4 = 0;
        goto LAB_0010ed57;
      }
      if ((long)psVar6->delta_time_pulses < 0) {
        __assert_fail("event->delta_time_pulses >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0xf6,"int write_event_time(smf_event_t *)");
      }
      iVar4 = format_vlq((uchar *)local_b8,0x80,(long)psVar6->delta_time_pulses);
      iVar4 = track_append(psVar6->track,local_b8,iVar4);
      if (iVar4 == 0) {
        iVar4 = smf_event_is_system_realtime(psVar6);
        if ((iVar4 == 0) && (iVar4 = smf_event_is_system_common(psVar6), iVar4 == 0)) {
          iVar4 = track_append(psVar6->track,psVar6->midi_buffer,psVar6->midi_buffer_length);
          goto joined_r0x0010ebc5;
        }
        local_c2 = 0xf7;
        iVar4 = smf_event_is_sysex(psVar6);
        if (iVar4 == 0) {
          iVar3 = track_append(psVar6->track,&local_c2,1);
          iVar4 = -1;
          if (iVar3 != 0) goto joined_r0x0010ebc5;
          iVar3 = format_vlq((uchar *)local_b8,0x80,(long)psVar6->midi_buffer_length);
          iVar3 = track_append(psVar6->track,local_b8,iVar3);
          if (iVar3 != 0) goto joined_r0x0010ebc5;
          psVar12 = psVar6->track;
          puVar19 = psVar6->midi_buffer;
          iVar4 = psVar6->midi_buffer_length;
        }
        else {
          local_c1 = 0xf0;
          iVar4 = smf_event_is_sysex(psVar6);
          if (iVar4 == 0) {
            __assert_fail("smf_event_is_sysex(event)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x101,"int write_sysex_contents(smf_event_t *)");
          }
          iVar3 = track_append(psVar6->track,&local_c1,1);
          iVar4 = -1;
          if (iVar3 != 0) goto joined_r0x0010ebc5;
          iVar3 = format_vlq((uchar *)local_b8,0x80,(long)psVar6->midi_buffer_length - 1);
          iVar3 = track_append(psVar6->track,local_b8,iVar3);
          if (iVar3 != 0) goto joined_r0x0010ebc5;
          psVar12 = psVar6->track;
          puVar19 = psVar6->midi_buffer + 1;
          iVar4 = psVar6->midi_buffer_length + -1;
        }
        iVar4 = track_append(psVar12,puVar19,iVar4);
        iVar4 = -(uint)(iVar4 != 0);
      }
    } while( true );
  }
LAB_0010ed6c:
  __s = fopen((char *)local_c0,"wb+");
  if (__s == (FILE *)0x0) {
    iVar18 = -1;
    pcVar16 = "Cannot open input file: %s";
  }
  else {
    sVar8 = fwrite(smf->file_buffer,1,(long)smf->file_buffer_length,__s);
    if (sVar8 == (long)smf->file_buffer_length) {
      iVar18 = fclose(__s);
      if (iVar18 == 0) {
        iVar18 = 0;
        bVar2 = true;
        goto LAB_0010ee1a;
      }
      iVar18 = -3;
      pcVar16 = "fclose(3) failed: %s";
    }
    else {
      iVar18 = -2;
      pcVar16 = "fwrite(3) failed: %s";
    }
  }
  piVar9 = __errno_location();
  pcVar10 = strerror(*piVar9);
  bVar2 = false;
  g_log("libsmf",8,pcVar16,pcVar10);
LAB_0010ee1a:
  free_buffer(smf);
  if (!bVar2) {
    return iVar18;
  }
  psVar11 = smf_load((char *)local_c0);
  if (psVar11 == (smf_t *)0x0) {
    __assert_fail("saved != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,600,"void assert_smf_saved_correctly(const smf_t *, const char *)");
  }
  if (smf->format != psVar11->format) {
    __assert_fail("a->format == b->format",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x246,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->ppqn != psVar11->ppqn) {
    __assert_fail("a->ppqn == b->ppqn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x247,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->frames_per_second != psVar11->frames_per_second) {
    __assert_fail("a->frames_per_second == b->frames_per_second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x248,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->resolution != psVar11->resolution) {
    __assert_fail("a->resolution == b->resolution",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x249,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (smf->number_of_tracks != psVar11->number_of_tracks) {
    __assert_fail("a->number_of_tracks == b->number_of_tracks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                  ,0x24a,"void assert_smf_is_identical(const smf_t *, const smf_t *)");
  }
  if (0 < smf->number_of_tracks) {
    iVar18 = 1;
    local_c0 = psVar11;
    do {
      psVar11 = local_c0;
      psVar5 = smf_get_track_by_number(smf,iVar18);
      psVar12 = smf_get_track_by_number(psVar11,iVar18);
      if (psVar5->track_number != psVar12->track_number) {
        __assert_fail("a->track_number == b->track_number",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x23a,
                      "void assert_smf_track_is_identical(const smf_track_t *, const smf_track_t *)"
                     );
      }
      if (psVar5->number_of_events != psVar12->number_of_events) {
        __assert_fail("a->number_of_events == b->number_of_events",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                      ,0x23b,
                      "void assert_smf_track_is_identical(const smf_track_t *, const smf_track_t *)"
                     );
      }
      if (0 < psVar5->number_of_events) {
        iVar4 = 0;
        do {
          iVar4 = iVar4 + 1;
          psVar6 = smf_track_get_event_by_number(psVar5,iVar4);
          psVar13 = smf_track_get_event_by_number(psVar12,iVar4);
          if (psVar6->event_number != psVar13->event_number) {
            __assert_fail("a->event_number == b->event_number",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x22c,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          if (psVar6->delta_time_pulses != psVar13->delta_time_pulses) {
            __assert_fail("a->delta_time_pulses == b->delta_time_pulses",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x22d,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          uVar15 = psVar6->time_pulses - psVar13->time_pulses;
          uVar14 = -uVar15;
          if (0 < (int)uVar15) {
            uVar14 = uVar15;
          }
          if (2 < uVar14) {
            __assert_fail("abs(a->time_pulses - b->time_pulses) <= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x22e,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          if (0.01 < ABS(psVar6->time_seconds - psVar13->time_seconds)) {
            __assert_fail("fabs(a->time_seconds - b->time_seconds) <= 0.01",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x22f,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          if (psVar6->track_number != psVar13->track_number) {
            __assert_fail("a->track_number == b->track_number",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x230,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          if (psVar6->midi_buffer_length != psVar13->midi_buffer_length) {
            __assert_fail("a->midi_buffer_length == b->midi_buffer_length",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x231,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
          iVar3 = bcmp(psVar6->midi_buffer,psVar13->midi_buffer,(long)psVar6->midi_buffer_length);
          if (iVar3 != 0) {
            __assert_fail("memcmp(a->midi_buffer, b->midi_buffer, a->midi_buffer_length) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_save.c"
                          ,0x232,
                          "void assert_smf_event_is_identical(const smf_event_t *, const smf_event_t *)"
                         );
          }
        } while (iVar4 < psVar5->number_of_events);
      }
      bVar2 = iVar18 < smf->number_of_tracks;
      psVar11 = local_c0;
      iVar18 = iVar18 + 1;
    } while (bVar2);
  }
  smf_delete(psVar11);
  return 0;
LAB_0010ed57:
  if (iVar4 != 0) {
    free_buffer(smf);
    return iVar4;
  }
  bVar2 = smf->number_of_tracks <= iVar18;
  iVar18 = iVar18 + 1;
  if (bVar2) goto LAB_0010ed6c;
  goto LAB_0010eb92;
}

Assistant:

int
smf_save(smf_t *smf, const char *file_name)
{
	int i, error;
	smf_track_t *track;

	smf_rewind(smf);

	assert(pointers_are_clear(smf));

	if (smf_validate(smf))
		return (-1);

	if (write_mthd_header(smf))
		return (-2);

	for (i = 1; i <= smf->number_of_tracks; i++) {
		track = smf_get_track_by_number(smf, i);

		assert(track != NULL);

		error = write_track(track);
		if (error) {
			free_buffer(smf);
			return (error);
		}
	}

	error = write_file(smf, file_name);

	free_buffer(smf);

	if (error)
		return (error);

#ifndef NDEBUG
	assert_smf_saved_correctly(smf, file_name);
#endif

	return (0);
}